

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void emitLoop(int loopStart)

{
  int iVar1;
  
  emitByte('\x1b');
  iVar1 = (current->function->chunk).count - loopStart;
  if (0xfffd < iVar1) {
    error("Loop body too large.");
  }
  iVar1 = iVar1 + 2;
  emitByte((uint8_t)((uint)iVar1 >> 8));
  emitByte((uint8_t)iVar1);
  return;
}

Assistant:

static void emitLoop(int loopStart) {
    emitByte(OP_LOOP);

    int offset = currentChunk()->count - loopStart + 2;
    if (offset > UINT16_MAX) error("Loop body too large.");

    emitByte((offset >> 8) & 0xff);
    emitByte(offset & 0xff);
}